

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O3

void __thiscall Moc::parsePluginData(Moc *this,ClassDef *def)

{
  QJsonDocument *this_00;
  char *pcVar1;
  QArrayData *pQVar2;
  qsizetype qVar3;
  char (*pacVar4) [22];
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> _Var5;
  bool bVar6;
  int iVar7;
  reference pQVar8;
  long lVar9;
  longlong __old_val;
  long lVar10;
  Data *pDVar11;
  QArrayData *pQVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  Symbol *pSVar13;
  QString *pQVar14;
  char *pcVar15;
  IncludePath *p;
  IncludePath *pIVar16;
  IncludePath *pIVar17;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  longlong __old_val_1;
  QFileInfo fi;
  QString local_1b0;
  QByteArray local_198;
  QByteArray local_178;
  QStringBuilder<const_char_(&)[22],_QByteArray> local_158;
  QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]> local_138;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]>,_QByteArray>
  local_108;
  QIODevice local_c8;
  QByteArray local_b8;
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> local_a0;
  QByteArray local_98;
  QByteArray local_78;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar9 = (this->super_Parser).symbols.d.size;
  lVar10 = (this->super_Parser).index;
  if ((lVar10 < lVar9) && ((this->super_Parser).symbols.d.ptr[lVar10].token == LPAREN)) {
    lVar10 = lVar10 + 1;
    (this->super_Parser).index = lVar10;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char *)0x0;
    local_58.d.size = 0;
    if (lVar10 < lVar9) {
      pSVar13 = (this->super_Parser).symbols.d.ptr;
      if (pSVar13[lVar10].token == IDENTIFIER) {
        do {
          (this->super_Parser).index = lVar10 + 1;
          local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          QByteArray::mid(&local_78,&pSVar13[lVar10].lex,pSVar13[lVar10].from,pSVar13[lVar10].len);
          local_108.a.a.a = (char (*) [22])0x17a60f;
          bVar6 = operator==(&local_78,(char **)&local_108);
          if (bVar6) {
            lVar9 = (this->super_Parser).index;
            if (((this->super_Parser).symbols.d.size <= lVar9) ||
               (pSVar13 = (this->super_Parser).symbols.d.ptr,
               pSVar13[lVar9].token != PP_STRING_LITERAL)) goto LAB_00129c33;
            (this->super_Parser).index = lVar9 + 1;
            QByteArray::mid((QByteArray *)&local_108,&pSVar13[lVar9].lex,pSVar13[lVar9].from + 1,
                            pSVar13[lVar9].len + -2);
            pQVar12 = &((def->pluginData).iid.d.d)->super_QArrayData;
            pQVar2 = (QArrayData *)(def->pluginData).iid.d.ptr;
            (def->pluginData).iid.d.d = (Data *)local_108.a.a.a;
            (def->pluginData).iid.d.ptr = (char *)local_108.a.a.b.d.d;
            pDVar11 = (Data *)(def->pluginData).iid.d.size;
            (def->pluginData).iid.d.size = (qsizetype)local_108.a.a.b.d.ptr;
            local_108.a.a.b.d.d = (Data *)pQVar2;
LAB_001294c8:
            local_108.a.a.a = (char (*) [22])pQVar12;
            local_108.a.a.b.d.ptr = (char *)pDVar11;
            if (pQVar12 != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&pQVar12->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)&pQVar12->ref_)->ref_)._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QArrayData *)&pQVar12->ref_)->ref_)._q_value.super___atomic_base<int>._M_i == 0
                 ) {
LAB_001294ea:
                QArrayData::deallocate(pQVar12,1,0x10);
              }
            }
          }
          else {
            local_108.a.a.a = (char (*) [22])0x17a613;
            bVar6 = operator==(&local_78,(char **)&local_108);
            if (bVar6) {
              lVar9 = (this->super_Parser).index;
              if ((lVar9 < (this->super_Parser).symbols.d.size) &&
                 (pSVar13 = (this->super_Parser).symbols.d.ptr,
                 pSVar13[lVar9].token == PP_STRING_LITERAL)) {
                (this->super_Parser).index = lVar9 + 1;
                QByteArray::mid((QByteArray *)&local_108,&pSVar13[lVar9].lex,pSVar13[lVar9].from + 1
                                ,pSVar13[lVar9].len + -2);
                pQVar12 = &((def->pluginData).uri.d.d)->super_QArrayData;
                pQVar2 = (QArrayData *)(def->pluginData).uri.d.ptr;
                (def->pluginData).uri.d.d = (Data *)local_108.a.a.a;
                (def->pluginData).uri.d.ptr = (char *)local_108.a.a.b.d.d;
                pDVar11 = (Data *)(def->pluginData).uri.d.size;
                (def->pluginData).uri.d.size = (qsizetype)local_108.a.a.b.d.ptr;
                local_108.a.a.b.d.d = (Data *)pQVar2;
                goto LAB_001294c8;
              }
              goto LAB_00129c33;
            }
            local_108.a.a.a = (char (*) [22])anon_var_dwarf_cf116;
            bVar6 = operator==(&local_78,(char **)&local_108);
            if (!bVar6) goto LAB_00129962;
            lVar9 = (this->super_Parser).index;
            if (((this->super_Parser).symbols.d.size <= lVar9) ||
               (pSVar13 = (this->super_Parser).symbols.d.ptr,
               pSVar13[lVar9].token != PP_STRING_LITERAL)) goto LAB_00129c33;
            (this->super_Parser).index = lVar9 + 1;
            local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_98.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
            pQVar12 = (QArrayData *)(pSVar13[lVar9].len + -2);
            QByteArray::mid(&local_98,&pSVar13[lVar9].lex,pSVar13[lVar9].from + 1,(qsizetype)pQVar12
                           );
            local_a0._M_head_impl = (QJsonDocumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar8 = std::stack<QByteArray,_QList<QByteArray>_>::top
                               (&(this->super_Parser).currentFilenames);
            ba.m_data = (storage_type *)pQVar12;
            ba.m_size = (qsizetype)(pQVar8->d).ptr;
            QString::fromLocal8Bit((QString *)&local_108,(QString *)(pQVar8->d).size,ba);
            QFileInfo::QFileInfo((QFileInfo *)&local_b8,(QString *)&local_108);
            QFileInfo::dir((QFileInfo *)&local_158);
            ba_00.m_data = (storage_type *)pQVar12;
            ba_00.m_size = (qsizetype)local_98.d.ptr;
            QString::fromLocal8Bit((QString *)&local_138,(QString *)local_98.d.size,ba_00);
            QFileInfo::QFileInfo((QFileInfo *)&local_a0,(QDir *)&local_158,(QString *)&local_138);
            if ((QArrayData *)local_138.a.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)*local_138.a.a)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)*local_138.a.a)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)*local_138.a.a)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_138.a.a,2,0x10);
              }
            }
            QDir::~QDir((QDir *)&local_158);
            QFileInfo::~QFileInfo((QFileInfo *)&local_b8);
            if ((QArrayData *)local_108.a.a.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)*local_108.a.a.a)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)*local_108.a.a.a)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)*local_108.a.a.a)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_108.a.a.a,2,0x10);
              }
            }
            lVar9 = (this->super_Parser).includes.d.size;
            if (lVar9 != 0) {
              pIVar16 = (this->super_Parser).includes.d.ptr;
              pIVar17 = pIVar16 + lVar9;
              do {
                bVar6 = QFileInfo::exists((QFileInfo *)&local_a0);
                if (bVar6) break;
                if (pIVar16->isFrameworkPath == false) {
                  pcVar15 = (pIVar16->path).d.ptr;
                  if (pcVar15 == (char *)0x0) {
                    pcVar15 = "";
                  }
                  pQVar14 = (QString *)0xffffffffffffffff;
                  do {
                    pcVar1 = pcVar15 + 1 + (long)pQVar14;
                    pQVar14 = (QString *)((long)&(pQVar14->d).d + 1);
                  } while (*pcVar1 != '\0');
                  ba_01.m_data = (storage_type *)pQVar12;
                  ba_01.m_size = (qsizetype)pcVar15;
                  QString::fromLocal8Bit((QString *)&local_108,pQVar14,ba_01);
                  QDir::QDir((QDir *)&local_158,(QString *)&local_108);
                  pcVar15 = local_98.d.ptr;
                  if (local_98.d.ptr == (char *)0x0) {
                    pcVar15 = "";
                  }
                  pQVar14 = (QString *)0xffffffffffffffff;
                  do {
                    pcVar1 = pcVar15 + 1 + (long)pQVar14;
                    pQVar14 = (QString *)((long)&(pQVar14->d).d + 1);
                  } while (*pcVar1 != '\0');
                  ba_02.m_data = (storage_type *)pQVar12;
                  ba_02.m_size = (qsizetype)pcVar15;
                  QString::fromLocal8Bit((QString *)&local_138,pQVar14,ba_02);
                  QFileInfo::setFile((QFileInfo *)&local_a0,(QDir *)&local_158,(QString *)&local_138
                                    );
                  if ((QArrayData *)local_138.a.a != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)*local_138.a.a)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)*local_138.a.a)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)*local_138.a.a)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_138.a.a,2,0x10);
                    }
                  }
                  QDir::~QDir((QDir *)&local_158);
                  if ((QArrayData *)local_108.a.a.a != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)*local_108.a.a.a)->_q_value).super___atomic_base<int>._M_i
                         = (((QBasicAtomicInt *)*local_108.a.a.a)->_q_value).
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)*local_108.a.a.a)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_108.a.a.a,2,0x10);
                    }
                  }
                  bVar6 = QFileInfo::isDir((QFileInfo *)&local_a0);
                  if (bVar6) {
                    QFileInfo::QFileInfo((QFileInfo *)&local_108);
                    _Var5._M_head_impl = local_a0._M_head_impl;
                    pQVar12 = (QArrayData *)local_108.a.a.a;
                    local_a0._M_head_impl = (QJsonDocumentPrivate *)local_108.a.a.a;
                    local_108.a.a.a = (char (*) [22])_Var5._M_head_impl;
                    QFileInfo::~QFileInfo((QFileInfo *)&local_108);
                  }
                }
                pIVar16 = pIVar16 + 1;
              } while (pIVar16 != pIVar17);
            }
            bVar6 = QFileInfo::exists((QFileInfo *)&local_a0);
            if (!bVar6) {
              local_158.b.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
              local_158.a = (char (*) [22])&DAT_aaaaaaaaaaaaaaaa;
              local_158.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              Parser::lexem(&local_b8,&this->super_Parser);
              local_108.a.a.b.d.size = local_b8.d.size;
              local_108.a.a.b.d.ptr = local_b8.d.ptr;
              local_108.a.a.b.d.d = local_b8.d.d;
              local_138.a.a = (char (*) [22])0x17a61c;
              local_b8.d.size = 0;
              local_108.a.a.a = (char (*) [22])0x17a61c;
              local_138.a.b.d.d = (Data *)0x0;
              local_138.a.b.d.ptr = (char *)0x0;
              local_b8.d.d = (Data *)0x0;
              local_b8.d.ptr = (char *)0x0;
              local_138.a.b.d.size = 0;
              local_108.a.b = (char (*) [23])0x17a632;
              QStringBuilder::operator_cast_to_QByteArray
                        ((ConvertTo *)&local_158,(QStringBuilder *)&local_108);
              QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[45]>::
              ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[45]>
                               *)&local_108);
              QStringBuilder<const_char_(&)[22],_QByteArray>::~QStringBuilder(&local_138.a);
              QByteArray::~QByteArray(&local_b8);
              pcVar15 = (char *)local_158.b.d.d;
LAB_00129e34:
              if ((Data *)pcVar15 == (Data *)0x0) {
                pcVar15 = "";
              }
              Parser::error(&this->super_Parser,pcVar15);
            }
            local_c8._vptr_QIODevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
            local_c8.d_ptr._M_t.
            super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
            super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
            super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
                 (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>
                  )&DAT_aaaaaaaaaaaaaaaa;
            QFileInfo::canonicalFilePath((QString *)&local_108,(QFileInfo *)&local_a0);
            QFile::QFile((QFile *)&local_c8,(QString *)&local_108);
            iVar7 = extraout_EDX;
            if ((QArrayData *)local_108.a.a.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)*local_108.a.a.a)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)*local_108.a.a.a)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)*local_108.a.a.a)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_108.a.a.a,2,0x10);
                iVar7 = extraout_EDX_00;
              }
            }
            iVar7 = QFile::open((QFile *)&local_c8,(char *)0x1,iVar7);
            if ((char)iVar7 == '\0') {
              local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_b8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
              Parser::lexem(&local_178,&this->super_Parser);
              qVar3 = local_178.d.size;
              pcVar15 = local_178.d.ptr;
              pDVar11 = local_178.d.d;
              local_158.a = (char (*) [22])0x17a61c;
              local_178.d.size = 0;
              local_138.a.a = (char (*) [22])0x17a61c;
              local_158.b.d.d = (Data *)0x0;
              local_158.b.d.ptr = (char *)0x0;
              local_158.b.d.size = 0;
              local_138.b = (char (*) [23])0x17a65f;
              local_178.d.d = (Data *)0x0;
              local_178.d.ptr = (char *)0x0;
              QIODevice::errorString(&local_1b0,&local_c8);
              QString::toUtf8(&local_198,&local_1b0);
              local_108.b.d.size = local_198.d.size;
              local_108.b.d.ptr = local_198.d.ptr;
              local_108.b.d.d = local_198.d.d;
              local_108.a.a.a = (char (*) [22])0x17a61c;
              local_138.a.b.d.d = (Data *)0x0;
              local_138.a.b.d.ptr = (char *)0x0;
              local_108.a.a.b.d.d = pDVar11;
              local_108.a.a.b.d.ptr = pcVar15;
              local_138.a.b.d.size = 0;
              local_108.a.a.b.d.size = qVar3;
              local_108.a.b = (char (*) [23])0x17a65f;
              local_198.d.d = (Data *)0x0;
              local_198.d.ptr = (char *)0x0;
              local_198.d.size = 0;
              QStringBuilder::operator_cast_to_QByteArray(&local_b8,(QStringBuilder *)&local_108);
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]>,_QByteArray>
              ::~QStringBuilder(&local_108);
              QByteArray::~QByteArray(&local_198);
              QString::~QString(&local_1b0);
              QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]>::
              ~QStringBuilder(&local_138);
              QStringBuilder<const_char_(&)[22],_QByteArray>::~QStringBuilder(&local_158);
              QByteArray::~QByteArray(&local_178);
              pcVar15 = local_b8.d.ptr;
              goto LAB_00129e34;
            }
            QFileInfo::canonicalFilePath((QString *)&local_108,(QFileInfo *)&local_a0);
            QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                      ((QMovableArrayOps<QString> *)&this->parsedPluginMetadataFiles,
                       (this->parsedPluginMetadataFiles).d.size,(QString *)&local_108);
            QList<QString>::end(&this->parsedPluginMetadataFiles);
            if ((QArrayData *)local_108.a.a.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)*local_108.a.a.a)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)*local_108.a.a.a)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)*local_108.a.a.a)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_108.a.a.a,2,0x10);
              }
            }
            QIODevice::readAll((QByteArray *)&local_108,&local_c8);
            pcVar1 = local_58.d.ptr;
            pDVar11 = local_58.d.d;
            pcVar15 = local_108.a.a.b.d.ptr;
            pacVar4 = local_108.a.a.a;
            local_108.a.a.a = (char (*) [22])local_58.d.d;
            local_58.d.d = (Data *)pacVar4;
            local_58.d.ptr = (char *)local_108.a.a.b.d.d;
            local_108.a.a.b.d.d = (Data *)pcVar1;
            local_108.a.a.b.d.ptr = (char *)local_58.d.size;
            local_58.d.size = (qsizetype)pcVar15;
            if (&pDVar11->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar11->super_QArrayData,1,0x10);
              }
            }
            QFile::~QFile((QFile *)&local_c8);
            QFileInfo::~QFileInfo((QFileInfo *)&local_a0);
            if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              pQVar12 = &(local_98.d.d)->super_QArrayData;
              if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i !=
                  0) goto LAB_00129962;
              goto LAB_001294ea;
            }
          }
LAB_00129962:
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
            }
          }
          lVar9 = (this->super_Parser).symbols.d.size;
          lVar10 = (this->super_Parser).index;
        } while ((lVar10 < lVar9) &&
                (pSVar13 = (this->super_Parser).symbols.d.ptr, pSVar13[lVar10].token == IDENTIFIER))
        ;
      }
      if ((Data *)local_58.d.size != (Data *)0x0) {
        QJsonDocument::fromJson((QJsonDocument *)&local_108,&local_58,(QJsonParseError *)0x0);
        this_00 = &(def->pluginData).metaData;
        QJsonDocument::swap(this_00,(QJsonDocument *)&local_108);
        QJsonDocument::~QJsonDocument((QJsonDocument *)&local_108);
        bVar6 = QJsonDocument::isObject(this_00);
        lVar10 = (this->super_Parser).index;
        if (!bVar6) {
          local_138.a.b.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          local_138.a.a = (char (*) [22])&DAT_aaaaaaaaaaaaaaaa;
          local_138.a.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          pSVar13 = (this->super_Parser).symbols.d.ptr;
          QByteArray::mid((QByteArray *)&local_158,&pSVar13[lVar10 + -1].lex,
                          pSVar13[lVar10 + -1].from,pSVar13[lVar10 + -1].len);
          local_108.a.a.b.d.size = (qsizetype)local_158.b.d.ptr;
          local_108.a.a.b.d.ptr = (char *)local_158.b.d.d;
          local_108.a.a.b.d.d = (Data *)local_158.a;
          local_158.b.d.ptr = (char *)0x0;
          local_108.a.a.a = (char (*) [22])0x17a61c;
          local_158.a = (char (*) [22])0x0;
          local_158.b.d.d = (Data *)0x0;
          local_108.a.b = (char (*) [23])0x17a676;
          QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[67]>::
          convertTo<QByteArray>
                    ((QByteArray *)&local_138,
                     (QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[67]>
                      *)&local_108);
          if (&(local_108.a.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_108.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_108.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_108.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_108.a.a.b.d.d)->super_QArrayData,1,0x10);
            }
          }
          if ((QArrayData *)local_158.a != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)*local_158.a)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)*local_158.a)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)*local_158.a)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_158.a,1,0x10);
            }
          }
          pcVar15 = (char *)local_138.a.b.d.d;
          if (local_138.a.b.d.d == (Data *)0x0) {
            pcVar15 = "";
          }
          Parser::warning(&this->super_Parser,pcVar15);
          pQVar12 = &((def->pluginData).iid.d.d)->super_QArrayData;
          (def->pluginData).iid.d.d = (Data *)0x0;
          (def->pluginData).iid.d.ptr = (char *)0x0;
          (def->pluginData).iid.d.size = 0;
          if (pQVar12 != (QArrayData *)0x0) {
            LOCK();
            (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar12,1,0x10);
            }
          }
          pQVar12 = &((def->pluginData).uri.d.d)->super_QArrayData;
          (def->pluginData).uri.d.d = (Data *)0x0;
          (def->pluginData).uri.d.ptr = (char *)0x0;
          (def->pluginData).uri.d.size = 0;
          if (pQVar12 != (QArrayData *)0x0) {
            LOCK();
            (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar12,1,0x10);
            }
          }
          if ((QArrayData *)local_138.a.a != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)*local_138.a.a)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)*local_138.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)*local_138.a.a)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_138.a.a,1,0x10);
            }
          }
          goto LAB_00129a36;
        }
        lVar9 = (this->super_Parser).symbols.d.size;
      }
    }
    this->mustIncludeQPluginH = true;
    if ((lVar10 < lVar9) && ((this->super_Parser).symbols.d.ptr[lVar10].token == PP_RPAREN)) {
      (this->super_Parser).index = lVar10 + 1;
LAB_00129a36:
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  }
LAB_00129c33:
  Parser::error(&this->super_Parser,(char *)0x0);
}

Assistant:

void Moc::parsePluginData(ClassDef *def)
{
    next(LPAREN);
    QByteArray metaData;
    while (test(IDENTIFIER)) {
        QByteArray l = lexem();
        if (l == "IID") {
            next(STRING_LITERAL);
            def->pluginData.iid = unquotedLexem();
        } else if (l == "URI") {
            next(STRING_LITERAL);
            def->pluginData.uri = unquotedLexem();
        } else if (l == "FILE") {
            next(STRING_LITERAL);
            QByteArray metaDataFile = unquotedLexem();
            QFileInfo fi(QFileInfo(QString::fromLocal8Bit(currentFilenames.top())).dir(),
                         QString::fromLocal8Bit(metaDataFile));
            for (const IncludePath &p : std::as_const(includes)) {
                if (fi.exists())
                    break;
                if (p.isFrameworkPath)
                    continue;

                fi.setFile(QString::fromLocal8Bit(p.path.constData()), QString::fromLocal8Bit(metaDataFile.constData()));
                // try again, maybe there's a file later in the include paths with the same name
                if (fi.isDir()) {
                    fi = QFileInfo();
                    continue;
                }
            }
            if (!fi.exists()) {
                const QByteArray msg = "Plugin Metadata file " + lexem()
                        + " does not exist. Declaration will be ignored";
                error(msg.constData());
                return;
            }
            QFile file(fi.canonicalFilePath());
            if (!file.open(QFile::ReadOnly)) {
                QByteArray msg = "Plugin Metadata file " + lexem() + " could not be opened: "
                    + file.errorString().toUtf8();
                error(msg.constData());
                return;
            }
            parsedPluginMetadataFiles.append(fi.canonicalFilePath());
            metaData = file.readAll();
        }
    }

    if (!metaData.isEmpty()) {
        def->pluginData.metaData = QJsonDocument::fromJson(metaData);
        if (!def->pluginData.metaData.isObject()) {
            const QByteArray msg = "Plugin Metadata file " + lexem()
                    + " does not contain a valid JSON object. Declaration will be ignored";
            warning(msg.constData());
            def->pluginData.iid = QByteArray();
            def->pluginData.uri = QByteArray();
            return;
        }
    }

    mustIncludeQPluginH = true;
    next(RPAREN);
}